

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colourspaces.c
# Opt level: O2

khr_df_primaries_e findMapping(Primaries *p,float latitude)

{
  float fVar1;
  long lVar2;
  
  lVar2 = 0x1c;
  do {
    if (lVar2 == 0x1a8) {
      return KHR_DF_PRIMARIES_UNSPECIFIED;
    }
    if ((*(float *)(basist::s_uastc_to_bc1_weights + lVar2 + 0x18) - p->Rx <= latitude) &&
       (p->Rx - *(float *)(basist::s_uastc_to_bc1_weights + lVar2 + 0x18) <= latitude)) {
      if ((*(float *)(basist::s_uastc_to_bc1_weights + lVar2 + 0x20) - p->Gx <= latitude) &&
         (p->Gx - *(float *)(basist::s_uastc_to_bc1_weights + lVar2 + 0x20) <= latitude)) {
        if ((*(float *)(basist::s_uastc_to_bc1_weights + lVar2 + 0x28) - p->Bx <= latitude) &&
           (p->Bx - *(float *)(basist::s_uastc_to_bc1_weights + lVar2 + 0x28) <= latitude)) {
          fVar1 = *(float *)((long)&primaryMap[0].dfPrimaryEnum + lVar2);
          if ((fVar1 - p->Wx <= latitude) && (p->Wx - fVar1 <= latitude)) {
            return *(khr_df_primaries_e *)(basist::s_uastc_to_bc1_weights + lVar2 + 0x14);
          }
        }
      }
    }
    lVar2 = lVar2 + 0x24;
  } while( true );
}

Assistant:

khr_df_primaries_e findMapping(const Primaries *p, float latitude) {
    unsigned int i;
    for (i = 0; i < sizeof(primaryMap)/sizeof(sPrimaryMapping); ++i) {
        if (primaryMap[i].primaries.Rx - p->Rx <= latitude && p->Rx - primaryMap[i].primaries.Rx <= latitude &&
            primaryMap[i].primaries.Gx - p->Gx <= latitude && p->Gx - primaryMap[i].primaries.Gx <= latitude &&
            primaryMap[i].primaries.Bx - p->Bx <= latitude && p->Bx - primaryMap[i].primaries.Bx <= latitude &&
            primaryMap[i].primaries.Wx - p->Wx <= latitude && p->Wx - primaryMap[i].primaries.Wx <= latitude) {
            return primaryMap[i].dfPrimaryEnum;
        }
    }
    /* No match */
    return KHR_DF_PRIMARIES_UNSPECIFIED;
}